

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

Bool IsValidColorCode(ctmbstr color)

{
  uint uVar1;
  Bool BVar2;
  void *pvVar3;
  long lVar4;
  
  uVar1 = prvTidytmbstrlen(color);
  if (uVar1 == 6) {
    lVar4 = 0;
    do {
      BVar2 = prvTidyIsDigit((int)color[lVar4]);
      if (BVar2 == no) {
        uVar1 = prvTidyToLower((int)color[lVar4]);
        pvVar3 = memchr("abcdef",uVar1,7);
        if (pvVar3 == (void *)0x0) goto LAB_0013d49e;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    BVar2 = yes;
  }
  else {
LAB_0013d49e:
    BVar2 = no;
  }
  return BVar2;
}

Assistant:

static Bool IsValidColorCode(ctmbstr color)
{
    uint i;

    if (TY_(tmbstrlen)(color) != 6)
        return no;

    /* check if valid hex digits and letters */
    for (i = 0; i < 6; i++)
        if (!TY_(IsDigit)(color[i]) && !strchr("abcdef", TY_(ToLower)(color[i])))
            return no;

    return yes;
}